

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

int __thiscall
unodb::detail::
basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::init(basic_inode_256<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
       *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int extraout_EAX;
  pointer __p;
  int iVar4;
  long in_RCX;
  void *in_RDX;
  ulong uVar5;
  ulong uVar6;
  uint in_R8D;
  
  uVar3 = 0;
  iVar4 = 0;
  do {
    uVar5 = (ulong)uVar3;
    uVar6 = (ulong)*(byte *)((long)in_RDX + uVar5 + 9);
    if (uVar6 == 0xff) {
      (this->children)._M_elems[uVar5].value.tagged_ptr = 0;
LAB_001a7afc:
      uVar3 = uVar3 + 1;
      bVar2 = true;
    }
    else {
      (this->children)._M_elems[uVar5].value.tagged_ptr =
           *(uintptr_t *)((long)in_RDX + uVar6 * 8 + 0x120);
      iVar4 = iVar4 + 1;
      if (iVar4 != 0x30) goto LAB_001a7afc;
      iVar4 = 0x30;
      bVar2 = false;
    }
    if (!bVar2) {
      if (uVar3 + 1 < 0x100) {
        memset((this->children)._M_elems + (uVar3 + 1),0,(ulong)(0xfe - uVar3) * 8 + 8);
      }
      uVar5 = *(ulong *)(in_RCX + 8);
      bVar1 = *(byte *)(uVar5 + 8 + (ulong)in_R8D);
      if ((this->children)._M_elems[bVar1].value.tagged_ptr == 0) {
        *(undefined8 *)(in_RCX + 8) = 0;
        if ((uVar5 & 7) == 0) {
          (this->children)._M_elems[bVar1].value.tagged_ptr = uVar5;
          free(in_RDX);
          db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>::
          decrement_inode_count<unodb::detail::inode_48<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                    ((db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>> *)ctx);
          return extraout_EAX;
        }
        __assert_fail("(result & ptr_bit_mask) == uintptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal.hpp"
                      ,0x182,
                      "static std::uintptr_t unodb::detail::basic_node_ptr<unodb::detail::node_header>::tag_ptr(const Header *, unodb::node_type) [Header = unodb::detail::node_header]"
                     );
      }
      __assert_fail("children[key_byte] == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                    ,0xa74,
                    "void unodb::detail::basic_inode_256<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::init(db_type &, inode48_type &__restrict, db_leaf_unique_ptr, tree_depth_type) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                   );
    }
  } while( true );
}

Assistant:

constexpr void init(db_type &db_instance,
                      inode48_type &__restrict source_node,
                      db_leaf_unique_ptr child,
                      tree_depth_type depth) noexcept {
    const auto reclaim_source_node{
        ArtPolicy::template make_db_inode_reclaimable_ptr<inode48_type>(
            &source_node, db_instance)};
    unsigned children_copied = 0;
    unsigned i = 0;
    while (true) {
      const auto children_i = source_node.child_indexes[i].load();
      if (children_i == inode48_type::empty_child) {
        children[i] = node_ptr{nullptr};
      } else {
        children[i] = source_node.children.pointer_array[children_i].load();
        ++children_copied;
        if (children_copied == inode48_type::capacity) break;
      }
      ++i;
    }

    ++i;
    for (; i < basic_inode_256::capacity; ++i) children[i] = node_ptr{nullptr};

    const auto key_byte = static_cast<uint8_t>(child->get_key_view()[depth]);
    UNODB_DETAIL_ASSERT(children[key_byte] == nullptr);
    children[key_byte] = node_ptr{child.release(), node_type::LEAF};
  }